

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regex.h
# Opt level: O2

bool __thiscall
rapidjson::internal::
GenericRegexSearch<rapidjson::internal::GenericRegex<rapidjson::UTF8<char>,rapidjson::CrtAllocator>,rapidjson::CrtAllocator>
::SearchWithAnchoring<rapidjson::GenericStringStream<rapidjson::UTF8<char>>>
          (GenericRegexSearch<rapidjson::internal::GenericRegex<rapidjson::UTF8<char>,rapidjson::CrtAllocator>,rapidjson::CrtAllocator>
           *this,GenericStringStream<rapidjson::UTF8<char>_> *is,bool anchorBegin,bool anchorEnd)

{
  uint uVar1;
  Stack<rapidjson::CrtAllocator> *pSVar2;
  bool bVar3;
  bool bVar4;
  uint codepoint;
  State *pSVar5;
  ulong __n;
  SizeType *pSVar6;
  Stack<rapidjson::CrtAllocator> *pSVar7;
  DecodedStream<rapidjson::GenericStringStream<rapidjson::UTF8<char>_>,_rapidjson::UTF8<char>_> ds;
  Stack<rapidjson::CrtAllocator> *local_58;
  DecodedStream<rapidjson::GenericStringStream<rapidjson::UTF8<char>_>,_rapidjson::UTF8<char>_>
  local_40;
  
  DecodedStream<rapidjson::GenericStringStream<rapidjson::UTF8<char>_>,_rapidjson::UTF8<char>_>::
  DecodedStream(&local_40,is);
  *(undefined8 *)(this + 0x30) = *(undefined8 *)(this + 0x28);
  __n = (ulong)(*(int *)(*(long *)this + 0x74) + 0x1fU >> 3 & 0xfffffffc);
  memset(*(void **)(this + 0x78),0,__n);
  bVar3 = GenericRegexSearch<rapidjson::internal::GenericRegex<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
          ::AddState((GenericRegexSearch<rapidjson::internal::GenericRegex<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                      *)this,(Stack<rapidjson::CrtAllocator> *)(this + 0x18),
                     *(SizeType *)(*(long *)this + 0x70));
  pSVar2 = (Stack<rapidjson::CrtAllocator> *)(this + 0x18);
  pSVar7 = (Stack<rapidjson::CrtAllocator> *)(this + 0x48);
  do {
    local_58 = pSVar7;
    pSVar7 = pSVar2;
    if ((pSVar7->stackTop_ == pSVar7->stack_) ||
       (codepoint = DecodedStream<rapidjson::GenericStringStream<rapidjson::UTF8<char>_>,_rapidjson::UTF8<char>_>
                    ::Take(&local_40), codepoint == 0)) {
      return bVar3;
    }
    bVar3 = false;
    memset(*(void **)(this + 0x78),0,__n);
    local_58->stackTop_ = local_58->stack_;
    for (pSVar6 = (SizeType *)pSVar7->stack_; pSVar2 = local_58,
        pSVar6 != (SizeType *)pSVar7->stackTop_; pSVar6 = pSVar6 + 1) {
      pSVar5 = GenericRegex<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::GetState
                         (*(GenericRegex<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> **)this,
                          *pSVar6);
      uVar1 = pSVar5->codepoint;
      if ((uVar1 == 0xffffffff || uVar1 == codepoint) ||
         ((uVar1 == 0xfffffffe &&
          (bVar4 = GenericRegexSearch<rapidjson::internal::GenericRegex<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                   ::MatchRange((GenericRegexSearch<rapidjson::internal::GenericRegex<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                                 *)this,pSVar5->rangeStart,codepoint), bVar4)))) {
        bVar4 = GenericRegexSearch<rapidjson::internal::GenericRegex<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                ::AddState((GenericRegexSearch<rapidjson::internal::GenericRegex<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                            *)this,local_58,pSVar5->out);
        bVar3 = (bool)(bVar4 | bVar3);
        if ((!anchorEnd) && (bVar3 != false)) {
          return true;
        }
      }
      if (!anchorBegin) {
        GenericRegexSearch<rapidjson::internal::GenericRegex<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
        ::AddState((GenericRegexSearch<rapidjson::internal::GenericRegex<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                    *)this,local_58,*(SizeType *)(*(long *)this + 0x70));
      }
    }
  } while( true );
}

Assistant:

bool SearchWithAnchoring(InputStream& is, bool anchorBegin, bool anchorEnd) {
        DecodedStream<InputStream, Encoding> ds(is);

        state0_.Clear();
        Stack<Allocator> *current = &state0_, *next = &state1_;
        const size_t stateSetSize = GetStateSetSize();
        std::memset(stateSet_, 0, stateSetSize);

        bool matched = AddState(*current, regex_.root_);
        unsigned codepoint;
        while (!current->Empty() && (codepoint = ds.Take()) != 0) {
            std::memset(stateSet_, 0, stateSetSize);
            next->Clear();
            matched = false;
            for (const SizeType* s = current->template Bottom<SizeType>(); s != current->template End<SizeType>(); ++s) {
                const State& sr = regex_.GetState(*s);
                if (sr.codepoint == codepoint ||
                    sr.codepoint == RegexType::kAnyCharacterClass || 
                    (sr.codepoint == RegexType::kRangeCharacterClass && MatchRange(sr.rangeStart, codepoint)))
                {
                    matched = AddState(*next, sr.out) || matched;
                    if (!anchorEnd && matched)
                        return true;
                }
                if (!anchorBegin)
                    AddState(*next, regex_.root_);
            }
            internal::Swap(current, next);
        }

        return matched;
    }